

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::DefinePropertiesHelperForGenericObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  PropertyId propId_00;
  Recycler *pRVar5;
  Var propertySpec;
  undefined4 *puVar6;
  PropertyRecord *pPVar7;
  char16 *varName;
  JavascriptEnumerator *local_130;
  size_t i_1;
  Var tempVar;
  size_t i;
  TrackAllocData local_108;
  DescriptorMap *local_e0;
  DescriptorMap *temp;
  JavascriptString *propertyName;
  PropertyRecord *propertyRecord;
  code *pcStack_c0;
  PropertyId propId;
  undefined8 local_b8;
  TrackAllocData local_b0;
  DescriptorMap *local_88;
  DescriptorMap *descriptors;
  JavascriptStaticEnumerator enumerator;
  size_t descCount;
  size_t descSize;
  ScriptContext *scriptContext_local;
  RecyclableObject *props_local;
  RecyclableObject *object_local;
  
  descCount = 0x10;
  enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)0x0;
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)&descriptors)
  ;
  iVar3 = (*(props->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])(props,&descriptors,2,scriptContext,0);
  if (iVar3 != 0) {
    EnterPinnedScope(&local_88);
    pRVar5 = ScriptContext::GetRecycler(scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b0,
               (type_info *)
               &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
                ::DescriptorMap::typeinfo,0,0x10,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
               ,0x775);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_b0);
    pcStack_c0 = Memory::Recycler::Alloc;
    local_b8 = 0;
    local_88 = Memory::
               AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,0x10);
    temp = (DescriptorMap *)0x0;
    while (temp = (DescriptorMap *)
                  JavascriptStaticEnumerator::MoveAndGetNext
                            ((JavascriptStaticEnumerator *)&descriptors,
                             (PropertyId *)((long)&propertyRecord + 4),(PropertyAttributes *)0x0),
          temp != (DescriptorMap *)0x0) {
      if (propertyRecord._4_4_ == -1) {
        ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,(JavascriptString *)temp,(PropertyRecord **)&propertyName);
        propertyRecord._4_4_ = PropertyRecord::GetPropertyId((PropertyRecord *)propertyName);
      }
      else {
        (*(((RecyclableObject *)&temp->propRecord)->super_FinalizableObject).
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(temp,&propertyName,0);
      }
      if (enumerator.arrayEnumerator.ptr == (JavascriptEnumerator *)descCount) {
        descCount = AllocSizeMath::Mul((size_t)enumerator.arrayEnumerator.ptr,2);
        pRVar5 = ScriptContext::GetRecycler(scriptContext);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_108,
                   (type_info *)
                   &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
                    ::DescriptorMap::typeinfo,0,descCount,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                   ,0x78d);
        pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_108);
        local_e0 = Memory::
                   AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                             ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,descCount);
        for (tempVar = (Var)0x0; tempVar < enumerator.arrayEnumerator.ptr;
            tempVar = (Var)((long)tempVar + 1)) {
          DefinePropertiesHelperForGenericObjects::DescriptorMap::operator=
                    (local_e0 + (long)tempVar,local_88 + (long)tempVar);
        }
        local_88 = local_e0;
      }
      propertySpec = Js::JavascriptOperators::GetPropertyNoCache
                               (props,propertyRecord._4_4_,scriptContext);
      if (descCount <= enumerator.arrayEnumerator.ptr) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                    ,0x798,"(descCount < descSize)","descCount < descSize");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      BVar4 = Js::JavascriptOperators::ToPropertyDescriptor
                        (propertySpec,&local_88[(long)enumerator.arrayEnumerator.ptr].descriptor,
                         scriptContext);
      if (BVar4 == 0) {
        pPVar7 = ScriptContext::GetPropertyName(scriptContext,propertyRecord._4_4_);
        varName = PropertyRecord::GetBuffer(pPVar7);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2c,varName);
      }
      Memory::WriteBarrierPtr<void>::operator=
                (&local_88[(long)enumerator.arrayEnumerator.ptr].originalVar,propertySpec);
      if ((DAT_01ec73cb & 1) != 0) {
        ModifyGetterSetterFuncName
                  ((PropertyRecord *)propertyName,
                   &local_88[(long)enumerator.arrayEnumerator.ptr].descriptor,scriptContext);
      }
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
                (&local_88[(long)enumerator.arrayEnumerator.ptr].propRecord,
                 (PropertyRecord *)propertyName);
      enumerator.arrayEnumerator.ptr =
           (JavascriptEnumerator *)
           ((long)&((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
           + 1);
    }
    temp = (DescriptorMap *)0x0;
    for (local_130 = (JavascriptEnumerator *)0x0; local_130 < enumerator.arrayEnumerator.ptr;
        local_130 = (JavascriptEnumerator *)
                    ((long)&(local_130->super_RecyclableObject).super_FinalizableObject.
                            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1)) {
      pPVar7 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                         (&local_88[(long)local_130].propRecord);
      propId_00 = PropertyRecord::GetPropertyId(pPVar7);
      DefineOwnPropertyHelper
                (object,propId_00,&local_88[(long)local_130].descriptor,scriptContext,true);
    }
    LeavePinnedScope();
  }
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForGenericObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    size_t descSize = 16;
    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
        Field(Var) originalVar;
    };

    JavascriptStaticEnumerator enumerator;
    if (!props->GetEnumerator(&enumerator, EnumeratorFlags::EnumSymbols, scriptContext))
    {
        return object;
    }

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

    PropertyId propId;
    PropertyRecord const * propertyRecord;
    JavascriptString* propertyName = nullptr;

    //enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(propId)) != NULL)
    {
        if (propId == Constants::NoProperty) //try current property id query first
        {
            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            propId = propertyRecord->GetPropertyId();
        }
        else
        {
            propertyName->GetPropertyRecord(&propertyRecord);
        }

        if (descCount == descSize)
        {
            //reallocate - consider linked list of DescriptorMap if the descSize is too high
            descSize = AllocSizeMath::Mul(descCount, 2);
            __analysis_assume(descSize == descCount * 2);
            DescriptorMap *temp = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

            for (size_t i = 0; i < descCount; i++)
            {
                temp[i] = descriptors[i];
            }
            descriptors = temp;
        }

        Var tempVar = JavascriptOperators::GetPropertyNoCache(props, propId, scriptContext);

        AnalysisAssert(descCount < descSize);
        if (!JavascriptOperators::ToPropertyDescriptor(tempVar, &descriptors[descCount].descriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propId)->GetBuffer());
        }
        // In proxy, we need to get back the original ToPropertDescriptor var in [[defineProperty]] trap.
        descriptors[descCount].originalVar = tempVar;

        if (CONFIG_FLAG(UseFullName))
        {
            ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
        }

        descriptors[descCount].propRecord = propertyRecord;

        descCount++;
    }

    //Once all the property descriptors are in place set each property descriptor to the object
    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    return object;
}